

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcdgen.h
# Opt level: O3

void __thiscall VcdGen::Signal::Signal(Signal *this,string *name,uint32_t width)

{
  pointer pcVar1;
  uint32_t index;
  VcdGen *this_00;
  string local_50;
  
  (this->name_)._M_dataplus._M_p = (pointer)&(this->name_).field_2;
  pcVar1 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)this,pcVar1,pcVar1 + name->_M_string_length);
  this->width_ = width;
  (this->encoded_name_)._M_dataplus._M_p = (pointer)&(this->encoded_name_).field_2;
  (this->encoded_name_)._M_string_length = 0;
  (this->encoded_name_).field_2._M_local_buf[0] = '\0';
  this_00 = (VcdGen *)(ulong)(uint)signal_count_;
  signal_count_ = signal_count_ + 1;
  encode_signal_name_abi_cxx11_(&local_50,this_00,index);
  std::__cxx11::string::operator=((string *)&this->encoded_name_,(string *)&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

Signal(string name, uint32_t width) 
    : name_(name), width_(width) {  

        encoded_name_ =  encode_signal_name(signal_count_++);
        #ifdef VCDGEN_DEBUG
            cout << "Init Signal " << name_ << " Encoded Name " << encoded_name_ << endl;
        #endif
    }